

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O0

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,5ul>,int,int,int,int,int,int>
               (SmallVector<(anonymous_namespace)::Constructable,_5UL> *v,int *args,int *args_1,
               int *args_2,int *args_3,int *args_4,int *args_5)

{
  StringRef capturedExpression;
  StringRef macroName;
  ExprLhs<bool> EVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  undefined4 *in_stack_00000008;
  AssertionHandler catchAssertionHandler;
  array<int,_6UL> a;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffefc;
  AssertionHandler *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  AssertionHandler *this;
  undefined4 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1c [12];
  Flags in_stack_ffffffffffffff30;
  AssertionHandler local_b0;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_8;
  
  local_48 = *in_RSI;
  local_44 = *in_RDX;
  local_40 = *in_RCX;
  local_3c = *in_R8;
  local_38 = *in_R9;
  local_34 = *in_stack_00000008;
  local_8 = in_RDI;
  local_b0.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_ffffffffffffff00,
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  this = &local_b0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
             ,0x6b);
  operator____catch_sr
            ((char *)in_stack_ffffffffffffff00,
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  uVar2 = 2;
  macroName._4_12_ = in_stack_ffffffffffffff1c;
  macroName.m_start._0_4_ = in_stack_ffffffffffffff18;
  capturedExpression.m_start._7_1_ = in_stack_ffffffffffffff0f;
  capturedExpression.m_start._0_7_ = in_stack_ffffffffffffff08;
  capturedExpression.m_size = (size_type)this;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_ffffffffffffff00,macroName,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffefc,2),capturedExpression,
             in_stack_ffffffffffffff30);
  std::ranges::__equal_fn::
  operator()<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_&,_std::array<int,_6UL>_&,_std::ranges::equal_to,_int_((anonymous_namespace)::Constructable::*)()_const,_std::identity>
            ((__equal_fn *)&std::ranges::equal,local_8,&local_48,
             anon_unknown.dwarf_70180c::Constructable::getValue,0);
  EVar1 = Catch::operator<=<bool,_0>((Decomposer *)CONCAT44(in_stack_fffffffffffffefc,uVar2),false);
  Catch::AssertionHandler::handleExpr<bool>
            (this,(ExprLhs<bool> *)CONCAT17(EVar1.m_lhs,in_stack_ffffffffffffff08));
  Catch::AssertionHandler::complete(in_stack_ffffffffffffff00);
  Catch::AssertionHandler::~AssertionHandler(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}